

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O3

void __thiscall leveldb::anon_unknown_3::DBIter::SeekToFirst(DBIter *this)

{
  pointer pcVar1;
  int iVar2;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this->direction_ = kForward;
  pcVar1 = (this->saved_value_)._M_dataplus._M_p;
  if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)pcVar1 == &(this->saved_value_).field_2) ||
     ((this->saved_value_).field_2._M_allocated_capacity < 0x100001)) {
    (this->saved_value_)._M_string_length = 0;
    *pcVar1 = '\0';
  }
  else {
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::swap
              (&local_40,&this->saved_value_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,
                      CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                               local_40.field_2._M_local_buf[0]) + 1);
    }
  }
  (*this->iter_->_vptr_Iterator[3])();
  iVar2 = (*this->iter_->_vptr_Iterator[2])();
  if ((char)iVar2 == '\0') {
    this->valid_ = false;
  }
  else {
    FindNextUserEntry(this,false,&this->saved_key_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DBIter::SeekToFirst() {
  direction_ = kForward;
  ClearSavedValue();
  iter_->SeekToFirst();
  if (iter_->Valid()) {
    FindNextUserEntry(false, &saved_key_ /* temporary storage */);
  } else {
    valid_ = false;
  }
}